

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaos.c
# Opt level: O0

void chaos_mode(dw_rom *rom)

{
  dw_rom *rom_local;
  
  if ((rom->flags[5] & 0xc) != 0) {
    chaos_enemy_stats(rom);
    chaos_zones(rom);
  }
  chaos_running(rom);
  chaos_enemy_drops(rom);
  chaos_xp(rom);
  chaos_weapon_prices(rom);
  return;
}

Assistant:

void chaos_mode(dw_rom *rom)
{
    if (RANDOM_ENEMY_STATS(rom)) {
        chaos_enemy_stats(rom);
        chaos_zones(rom);
    }

    chaos_running(rom);
    chaos_enemy_drops(rom);
    chaos_xp(rom);
    chaos_weapon_prices(rom);
}